

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::CompressString(cmCTest *this,string *str)

{
  Bytef *pBVar1;
  int iVar2;
  uInt uVar3;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> base64EncodedBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  long *local_238 [2];
  long local_228 [2];
  undefined1 local_218 [112];
  ios_base local_1a8 [264];
  z_stream local_a0;
  
  local_a0.zalloc = (alloc_func)0x0;
  local_a0.zfree = (free_func)0x0;
  local_a0.opaque = (voidpf)0x0;
  iVar2 = cm_zlib_deflateInit_(&local_a0,-1,"1.2.12",0x70);
  if (iVar2 == 0) {
    pBVar1 = (Bytef *)(str->_M_dataplus)._M_p;
    uVar3 = (uInt)((((double)CONCAT44(0x45300000,(int)(str->_M_string_length >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)str->_M_string_length) - 4503599627370496.0)) *
                   1.001 + 13.0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_250,(long)(int)uVar3,(allocator_type *)local_218);
    local_a0.avail_in = (uInt)str->_M_string_length;
    local_a0.next_out =
         local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a0.next_in = pBVar1;
    local_a0.avail_out = uVar3;
    iVar2 = cm_zlib_deflate(&local_a0,4);
    bVar4 = iVar2 == 1;
    if (bVar4) {
      cm_zlib_deflateEnd(&local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                 (long)((int)(uVar3 * 3) / 2),(allocator_type *)local_238);
      cmsysBase64_Encode(local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,local_a0.total_out,
                         (uchar *)local_218._0_8_,1);
      std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,local_218._0_8_);
      if ((_func_int **)local_218._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Error during gzip compression.",0x1e);
      std::ios::widen((char)(ostream *)local_218 + (char)*(_func_int **)(local_218._0_8_ + -0x18));
      std::ostream::put((char)local_218);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xea4,(char *)local_238[0],false);
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      std::ios_base::~ios_base(local_1a8);
    }
    if (local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmCTest::CompressString(std::string& str)
{
  int ret;
  z_stream strm;

  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, -1); // default compression level
  if (ret != Z_OK) {
    return false;
  }

  unsigned char* in =
    reinterpret_cast<unsigned char*>(const_cast<char*>(str.c_str()));
  // zlib makes the guarantee that this is the maximum output size
  int outSize =
    static_cast<int>(static_cast<double>(str.size()) * 1.001 + 13.0);
  std::vector<unsigned char> out(outSize);

  strm.avail_in = static_cast<uInt>(str.size());
  strm.next_in = in;
  strm.avail_out = outSize;
  strm.next_out = out.data();
  ret = deflate(&strm, Z_FINISH);

  if (ret != Z_STREAM_END) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Error during gzip compression." << std::endl);
    return false;
  }

  (void)deflateEnd(&strm);

  // Now base64 encode the resulting binary string
  std::vector<unsigned char> base64EncodedBuffer((outSize * 3) / 2);

  size_t rlen = cmsysBase64_Encode(out.data(), strm.total_out,
                                   base64EncodedBuffer.data(), 1);

  str.assign(reinterpret_cast<char*>(base64EncodedBuffer.data()), rlen);

  return true;
}